

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

_Bool mem_is_zero(void *mem,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (len == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (*(char *)((long)mem + uVar2) == '\0');
  return len <= uVar2;
}

Assistant:

static bool mem_is_zero(const void *mem, size_t len)
{
    size_t i;
    for (i = 0; i < len; ++i)
        if (((const unsigned char *)mem)[i])
            return false;
    return true;
}